

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::VisitFieldsTest_MutateNothingByVisitIdempotent_Test::
~VisitFieldsTest_MutateNothingByVisitIdempotent_Test
          (VisitFieldsTest_MutateNothingByVisitIdempotent_Test *this)

{
  (this->super_VisitFieldsTest).
  super_TestWithParam<google::protobuf::internal::(anonymous_namespace)::TestParam>.super_Test.
  _vptr_Test = (_func_int **)&PTR__VisitFieldsTest_01913730;
  (this->super_VisitFieldsTest).
  super_TestWithParam<google::protobuf::internal::(anonymous_namespace)::TestParam>.
  super_WithParamInterface<google::protobuf::internal::(anonymous_namespace)::TestParam>.
  _vptr_WithParamInterface = (_func_int **)&PTR__VisitFieldsTest_01913770;
  ThreadSafeArena::~ThreadSafeArena(&(this->super_VisitFieldsTest).arena_.impl_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

TEST_P(VisitFieldsTest, MutateNothingByVisitIdempotent) {
  std::string data;
  ASSERT_TRUE(message_->SerializeToString(&data));

  MutateNothingByVisit(*message_);

  // Checking the identity by comparing serialize bytes is discouraged, but this
  // allows us to be type-agnostic for this test. Also, the back to back
  // serialization should be stable.
  EXPECT_EQ(data, message_->SerializeAsString());
}